

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-slays.c
# Opt level: O0

_Bool same_monsters_slain(wchar_t slay1,wchar_t slay2)

{
  int iVar1;
  wchar_t slay2_local;
  wchar_t slay1_local;
  
  if (slays[slay1].race_flag == slays[slay2].race_flag) {
    if ((slays[slay1].base == (char *)0x0) && (slays[slay2].base == (char *)0x0)) {
      slay2_local._3_1_ = true;
    }
    else if ((slays[slay1].base == (char *)0x0) || (slays[slay2].base != (char *)0x0)) {
      if ((slays[slay1].base == (char *)0x0) && (slays[slay2].base != (char *)0x0)) {
        slay2_local._3_1_ = false;
      }
      else {
        iVar1 = strcmp(slays[slay1].base,slays[slay2].base);
        if (iVar1 == 0) {
          slay2_local._3_1_ = true;
        }
        else {
          slay2_local._3_1_ = false;
        }
      }
    }
    else {
      slay2_local._3_1_ = false;
    }
  }
  else {
    slay2_local._3_1_ = false;
  }
  return slay2_local._3_1_;
}

Assistant:

bool same_monsters_slain(int slay1, int slay2)
{
	if (slays[slay1].race_flag != slays[slay2].race_flag) return false;
	if (!slays[slay1].base && !slays[slay2].base) return true;
	if (slays[slay1].base && !slays[slay2].base) return false;
	if (!slays[slay1].base && slays[slay2].base) return false;
	if (streq(slays[slay1].base, slays[slay2].base)) return true;
	return false;
}